

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

Pseudo * linearize_negate_condition(Proc *proc,int line_number,Pseudo *pseudo,Pseudo *not_pseudo)

{
  C_MemoryAllocator *pCVar1;
  undefined1 *ptr;
  Pseudo *pseudo_00;
  Pseudo *ptr_00;
  
  pCVar1 = proc->linearizer->compiler_state->allocator;
  ptr = (undefined1 *)(*pCVar1->calloc)(pCVar1->arena,1,0x28);
  *ptr = 0x38;
  *(int *)(ptr + 0x20) = line_number;
  if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    pseudo_00 = indexed_load(proc,pseudo);
    ptr_00 = pseudo_00;
  }
  else {
    pseudo_00 = (Pseudo *)0x0;
    ptr_00 = pseudo;
  }
  raviX_ptrlist_add((PtrList **)(ptr + 8),ptr_00,proc->linearizer->compiler_state->allocator);
  free_temp_pseudo(proc,pseudo,false);
  if (((undefined1  [48])*not_pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    raviX_ptrlist_add((PtrList **)(ptr + 0x10),not_pseudo,
                      proc->linearizer->compiler_state->allocator);
    if (*(BasicBlock **)(ptr + 0x18) == proc->current_bb ||
        *(BasicBlock **)(ptr + 0x18) == (BasicBlock *)0x0) {
      raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                        proc->linearizer->compiler_state->allocator);
      *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
      if (pseudo_00 != (Pseudo *)0x0) {
        free_temp_pseudo(proc,pseudo_00,false);
      }
      return not_pseudo;
    }
    __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x1b1,"void add_instruction(Proc *, Instruction *)");
  }
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static Pseudo *linearize_negate_condition(Proc *proc, int line_number, Pseudo *pseudo, Pseudo *not_pseudo) {
	Instruction *not_insn = allocate_instruction(proc, op_not, line_number);
	Pseudo *tofree = add_instruction_operand(proc, not_insn, pseudo);
	free_temp_pseudo(proc, pseudo, false);//CHECK
	add_instruction_target(proc, not_insn, not_pseudo);
	add_instruction(proc, not_insn);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
	return not_pseudo;
}